

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MicroString::SetUnowned
          (MicroString *this,UnownedPayload *unowned_input,Arena *arena)

{
  LargeRepKind v1;
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  if (arena == (Arena *)0x0) {
    Destroy(this);
  }
  this->rep_ = (void *)((ulong)unowned_input | 1);
  v1 = large_rep_kind(this);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (v1,1,"+large_rep_kind() == +kUnowned");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
             ,0x11f,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

void MicroString::SetUnowned(const UnownedPayload& unowned_input,
                             Arena* arena) {
  if (arena == nullptr) Destroy();
  rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(&unowned_input) |
                                 kIsLargeRepTag);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kUnowned);
}